

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O3

void ScaKwdHdr(GmfMshSct *msh,int KwdCod)

{
  int *piVar1;
  byte *pbVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  long lVar6;
  int *piVar7;
  int local_34;
  
  uVar5 = (byte)*GmfKwdFmt[KwdCod][1] - 0x69;
  if (uVar5 == 0) {
    uVar5 = (uint)(byte)GmfKwdFmt[KwdCod][1][1];
  }
  if (uVar5 == 0) {
    if ((msh->typ & 1) == 0) {
      if (msh->ver < 4) {
        ScaWrd(msh,&local_34);
        msh->KwdTab[KwdCod].NmbLin = (long)local_34;
      }
      else {
        ScaDblWrd(msh,&msh->KwdTab[KwdCod].NmbLin);
      }
    }
    else {
      iVar3 = __isoc99_fscanf(msh->hdl,"%ld",&msh->KwdTab[KwdCod].NmbLin);
      if (iVar3 != 1) goto LAB_0010e87b;
    }
  }
  else {
    msh->KwdTab[KwdCod].NmbLin = 1;
  }
  pbVar2 = (byte *)GmfKwdFmt[KwdCod][2];
  uVar5 = *pbVar2 - 0x73;
  if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
    uVar5 = (uint)pbVar2[2];
  }
  if (uVar5 != 0) {
    uVar5 = *pbVar2 - 0x68;
    if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
      uVar5 = (uint)pbVar2[2];
    }
    if (uVar5 != 0) goto LAB_0010e84f;
  }
  if ((msh->typ & 1) == 0) {
    piVar1 = &msh->KwdTab[KwdCod].NmbTyp;
    ScaWrd(msh,piVar1);
    if (0 < msh->KwdTab[KwdCod].NmbTyp) {
      piVar7 = msh->KwdTab[KwdCod].TypTab;
      lVar6 = 0;
      do {
        ScaWrd(msh,piVar7);
        lVar6 = lVar6 + 1;
        piVar7 = piVar7 + 1;
      } while (lVar6 < *piVar1);
    }
    pbVar2 = (byte *)GmfKwdFmt[KwdCod][2];
    uVar5 = *pbVar2 - 0x68;
    if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
      uVar5 = (uint)pbVar2[2];
    }
    piVar1 = &msh->KwdTab[KwdCod].deg;
    piVar7 = &msh->KwdTab[KwdCod].NmbNod;
    if (uVar5 == 0) {
      ScaWrd(msh,piVar1);
      ScaWrd(msh,piVar7);
    }
    else {
      *piVar1 = 0;
      *piVar7 = 1;
    }
  }
  else {
    piVar1 = &msh->KwdTab[KwdCod].NmbTyp;
    iVar3 = __isoc99_fscanf(msh->hdl,"%d",piVar1);
    if (iVar3 != 1) {
LAB_0010e87b:
      longjmp((__jmp_buf_tag *)msh->err,-1);
    }
    if (0 < *piVar1) {
      piVar7 = msh->KwdTab[KwdCod].TypTab;
      lVar6 = 0;
      do {
        iVar3 = __isoc99_fscanf(msh->hdl,"%d",piVar7);
        if (iVar3 != 1) goto LAB_0010e87b;
        lVar6 = lVar6 + 1;
        piVar7 = piVar7 + 1;
      } while (lVar6 < *piVar1);
    }
    pbVar2 = (byte *)GmfKwdFmt[KwdCod][2];
    uVar5 = *pbVar2 - 0x68;
    if ((uVar5 == 0) && (uVar5 = pbVar2[1] - 0x72, uVar5 == 0)) {
      uVar5 = (uint)pbVar2[2];
    }
    if (uVar5 == 0) {
      iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->KwdTab[KwdCod].deg);
      if ((iVar3 != 1) ||
         (iVar3 = __isoc99_fscanf(msh->hdl,"%d",&msh->KwdTab[KwdCod].NmbNod), iVar3 != 1))
      goto LAB_0010e87b;
    }
    else {
      msh->KwdTab[KwdCod].deg = 0;
      msh->KwdTab[KwdCod].NmbNod = 1;
    }
  }
LAB_0010e84f:
  ExpFmt(msh,KwdCod);
  sVar4 = ftell((FILE *)msh->hdl);
  msh->KwdTab[KwdCod].pos = sVar4;
  return;
}

Assistant:

static void ScaKwdHdr(GmfMshSct *msh, int KwdCod)
{
   int      i;
   KwdSct   *kwd = &msh->KwdTab[ KwdCod ];

   if(!strcmp("i", GmfKwdFmt[ KwdCod ][1]))
      if(msh->typ & Asc)
         safe_fscanf(msh->hdl, INT64_T_FMT, &kwd->NmbLin, msh->err);
      else
         if(msh->ver <= 3)
         {
            ScaWrd(msh, (unsigned char *)&i);
            kwd->NmbLin = i;
         }
         else
            ScaDblWrd(msh, (unsigned char *)&kwd->NmbLin);
   else
      kwd->NmbLin = 1;

   if(!strcmp("sr", GmfKwdFmt[ KwdCod ][2])
   || !strcmp("hr", GmfKwdFmt[ KwdCod ][2]) )
   {
      if(msh->typ & Asc)
      {
         safe_fscanf(msh->hdl, "%d", &kwd->NmbTyp, msh->err);

         for(i=0;i<kwd->NmbTyp;i++)
            safe_fscanf(msh->hdl, "%d", &kwd->TypTab[i], msh->err);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            safe_fscanf(msh->hdl, "%d", &kwd->deg, msh->err);
            safe_fscanf(msh->hdl, "%d", &kwd->NmbNod, msh->err);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }

      }
      else
      {
         ScaWrd(msh, (unsigned char *)&kwd->NmbTyp);

         for(i=0;i<kwd->NmbTyp;i++)
            ScaWrd(msh, (unsigned char *)&kwd->TypTab[i]);

         // Scan two extra fields for HO solutions: deg and nmb Nodes
         if(!strcmp("hr", GmfKwdFmt[ KwdCod ][2]))
         {
            ScaWrd(msh, (unsigned char *)&kwd->deg);
            ScaWrd(msh, (unsigned char *)&kwd->NmbNod);
         }
         else
         {
            kwd->deg = 0;
            kwd->NmbNod = 1;
         }
      }
   }

   ExpFmt(msh, KwdCod);
   kwd->pos = GetFilPos(msh);
}